

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Abc_Ntk_t * Ver_ParseFindOrCreateNetwork(Ver_Man_t *pMan,char *pName)

{
  char *pcVar1;
  Abc_Ntk_t *pNtkNew;
  char *pName_local;
  Ver_Man_t *pMan_local;
  
  pMan_local = (Ver_Man_t *)Abc_DesFindModelByName(pMan->pDesign,pName);
  if (pMan_local == (Ver_Man_t *)0x0) {
    pMan_local = (Ver_Man_t *)Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_BLACKBOX,pMan->fUseMemMan);
    pcVar1 = Extra_UtilStrsav(pName);
    *(char **)&pMan_local->fCheck = pcVar1;
    pMan_local->pFileName = (char *)0x0;
    Abc_DesAddModel(pMan->pDesign,(Abc_Ntk_t *)pMan_local);
  }
  return (Abc_Ntk_t *)pMan_local;
}

Assistant:

Abc_Ntk_t * Ver_ParseFindOrCreateNetwork( Ver_Man_t * pMan, char * pName )
{
    Abc_Ntk_t * pNtkNew;
    // check if the network exists
    if ( (pNtkNew = Abc_DesFindModelByName( pMan->pDesign, pName )) )
        return pNtkNew;
//printf( "Creating network %s.\n", pName );
    // create new network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_BLACKBOX, pMan->fUseMemMan );
    pNtkNew->pName = Extra_UtilStrsav( pName );
    pNtkNew->pSpec = NULL;
    // add module to the design
    Abc_DesAddModel( pMan->pDesign, pNtkNew );
    return pNtkNew;
}